

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O3

void CompiledMixedType<unsigned_short,unsigned_long_long>(void)

{
  unsigned_short ret;
  unsigned_short local_34 [2];
  unsigned_long_long local_30;
  unsigned_short local_22;
  
  local_34[0] = 0;
  local_30 = 0;
  local_34[1] = 0;
  MultiplicationHelper<unsigned_short,_unsigned_long_long,_8>::
  MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (local_34,&local_30,local_34 + 1);
  local_30 = 0;
  local_34[1] = 0;
  local_22 = local_34[0];
  MultiplicationHelper<unsigned_short,_unsigned_long_long,_8>::
  MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_22,&local_30,local_34 + 1);
  local_30 = 0;
  MultiplicationHelper<unsigned_short,_unsigned_long_long,_8>::
  MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(local_34,&local_30,local_34);
  local_30 = 0;
  MultiplicationHelper<unsigned_short,_unsigned_long_long,_8>::
  MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(local_34,&local_30,local_34);
  local_34[0] = 1;
  operator/(1,(SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
  if ((local_34[0] != 0xffff) && (local_34[0] = local_34[0] + 1, local_34[0] != 0xffff)) {
    local_34[0] = 0;
    operator-(0,(SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}